

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O0

Status __thiscall
flatbuffers::anon_unknown_7::TextCodeGenerator::GenerateCode
          (TextCodeGenerator *this,Parser *parser,string *path,string *filename)

{
  char *__s;
  allocator<char> local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  char *local_38;
  char *err;
  string *filename_local;
  string *path_local;
  Parser *parser_local;
  TextCodeGenerator *this_local;
  
  err = (char *)filename;
  filename_local = path;
  path_local = (string *)parser;
  parser_local = (Parser *)this;
  __s = GenTextFile(parser,path,filename);
  if (__s != (char *)0x0) {
    local_38 = __s;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,__s,&local_99);
    std::operator+(&local_78," (",&local_98);
    std::operator+(&local_58,&local_78,")");
    std::__cxx11::string::operator=
              ((string *)&(this->super_CodeGenerator).status_detail,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
  }
  this_local._4_4_ = (Status)(__s != (char *)0x0);
  return this_local._4_4_;
}

Assistant:

Status GenerateCode(const Parser &parser, const std::string &path,
                      const std::string &filename) override {
    auto err = GenTextFile(parser, path, filename);
    if (err) {
      status_detail = " (" + std::string(err) + ")";
      return Status::ERROR;
    }
    return Status::OK;
  }